

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O1

Vec3f TRM::barycentric<2ul>
                (vec<2,_float,_(glm::qualifier)0> A,vec<2,_float,_(glm::qualifier)0> B,
                vec<2,_float,_(glm::qualifier)0> C,vec<2,_float,_(glm::qualifier)0> P)

{
  long lVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar6;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar7;
  Vec3f VVar8;
  Vec3f VVar9;
  Vec3f s [2];
  
  lVar1 = -0xc;
  do {
    bVar2 = lVar1 != 0;
    aVar6.x = A.field_1;
    aVar7.x = C.field_1;
    if (bVar2) {
      aVar6 = A.field_0;
      aVar7 = C.field_0;
    }
    *(float *)((long)&s[1].field_0 + lVar1) = aVar7.x - aVar6.x;
    aVar7.x = B.field_1;
    if (bVar2) {
      aVar7 = B.field_0;
    }
    *(float *)((long)&s[1].field_1 + lVar1) = aVar7.x - aVar6.x;
    aVar7.x = P.field_1;
    if (bVar2) {
      aVar7 = P.field_0;
    }
    *(float *)((long)&s[1].field_2 + lVar1) = aVar6.x - aVar7.x;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 == 0);
  fVar5 = s[0].field_0.x * s[1].field_1.y - s[0].field_1.y * s[1].field_0.x;
  if (0.01 < ABS(fVar5)) {
    fVar4 = s[1].field_0.x * s[0].field_2.z - s[0].field_0.x * s[1].field_2.z;
    fVar3 = s[0].field_1.y * s[1].field_2.z - s[1].field_1.y * s[0].field_2.z;
    VVar8.field_0 = 1.0 - (fVar3 + fVar4) / fVar5;
    VVar8.field_1.y = fVar4 / fVar5;
    VVar8.field_2.z = fVar3 / fVar5;
    return VVar8;
  }
  VVar9.field_2.z = 1.0;
  VVar9.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  VVar9.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  return VVar9;
}

Assistant:

Vec3f barycentric(glm::vec<DimRows, float, glm::defaultp> A,
                  glm::vec<DimRows, float, glm::defaultp> B,
                  glm::vec<DimRows, float, glm::defaultp> C,
                  glm::vec<DimRows, float, glm::defaultp> P) {
  if (DimRows < 2) {
    return Vec3f(1., 1., 1.);
  } else {
    Vec3f s[2];
    for (int i = 0; i < 2; i++) {
      s[i][0] = C[i] - A[i];
      s[i][1] = B[i] - A[i];
      s[i][2] = A[i] - P[i];
    }
    Vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is
                                // zero then triangle ABC is degenerate
      return Vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return Vec3f(-1, 1, 1);  // in this case generate negative coordinates, it
                             // will be thrown away by the rasterizator
  }
}